

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto3_arena_unittest::TestUnpackedTypes::_InternalSerialize
          (TestUnpackedTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_int> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  float fVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  unsigned_long uVar10;
  int iVar11;
  uint uVar12;
  const_reference piVar13;
  ulong uVar14;
  ulong *puVar15;
  const_reference puVar16;
  const_reference puVar17;
  const_reference plVar18;
  const_reference pfVar19;
  const_reference pdVar20;
  const_reference pbVar21;
  uint8_t *puVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  byte *pbVar26;
  
  iVar11 = google::protobuf::internal::SooRep::size
                     ((SooRep *)&(this->field_0)._impl_,
                      (undefined1  [232])((undefined1  [232])this->field_0 & (undefined1  [232])0x4)
                      == (undefined1  [232])0x0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar13 = google::protobuf::RepeatedField<int>::Get
                          (&(this->field_0)._impl_.repeated_int32_,iVar25);
      uVar14 = (ulong)*piVar13;
      pbVar26 = target + 1;
      *target = 8;
      uVar24 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar26 = (byte)uVar24 | 0x80;
          uVar14 = uVar24 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar24;
          uVar24 = uVar14;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar14;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_int64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,
                      (undefined1  [232])((undefined1  [232])this->field_0 & (undefined1  [232])0x4)
                      == (undefined1  [232])0x0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar15 = (ulong *)google::protobuf::RepeatedField<long>::Get(pRVar1,iVar25);
      uVar24 = *puVar15;
      *target = 0x10;
      pbVar26 = target + 1;
      uVar14 = uVar24;
      if (0x7f < uVar24) {
        do {
          *pbVar26 = (byte)uVar14 | 0x80;
          uVar24 = uVar14 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar14;
          uVar14 = uVar24;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar24;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar2 = &(this->field_0)._impl_.repeated_uint32_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar16 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar2,iVar25);
      uVar23 = *puVar16;
      *target = 0x18;
      pbVar26 = target + 1;
      uVar12 = uVar23;
      if (0x7f < uVar23) {
        do {
          *pbVar26 = (byte)uVar12 | 0x80;
          uVar23 = uVar12 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar12;
          uVar12 = uVar23;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar23;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar3 = &(this->field_0)._impl_.repeated_uint64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x30) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar17 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar3,iVar25);
      uVar24 = *puVar17;
      *target = 0x20;
      pbVar26 = target + 1;
      uVar14 = uVar24;
      if (0x7f < uVar24) {
        do {
          *pbVar26 = (byte)uVar14 | 0x80;
          uVar24 = uVar14 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar14;
          uVar14 = uVar24;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar24;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar4 = &(this->field_0)._impl_.repeated_sint32_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x40) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar13 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar25);
      iVar8 = *piVar13;
      *target = 0x28;
      pbVar26 = target + 1;
      uVar12 = iVar8 >> 0x1f ^ iVar8 * 2;
      uVar23 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar26 = (byte)uVar23 | 0x80;
          uVar12 = uVar23 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar23;
          uVar23 = uVar12;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar12;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_sint64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x50) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      plVar18 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar25);
      lVar9 = *plVar18;
      *target = 0x30;
      pbVar26 = target + 1;
      uVar14 = lVar9 >> 0x3f ^ lVar9 * 2;
      uVar24 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar26 = (byte)uVar24 | 0x80;
          uVar14 = uVar24 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar24;
          uVar24 = uVar14;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar14;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  pRVar2 = &(this->field_0)._impl_.repeated_fixed32_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar2->soo_rep_,(*(byte *)((long)&this->field_0 + 0x60) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar16 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar2,iVar25);
      uVar23 = *puVar16;
      *target = 0x3d;
      *(uint *)(target + 1) = uVar23;
      target = target + 5;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  pRVar3 = &(this->field_0)._impl_.repeated_fixed64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar3->soo_rep_,(*(byte *)((long)&this->field_0 + 0x70) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar17 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar3,iVar25);
      uVar10 = *puVar17;
      *target = 0x41;
      *(unsigned_long *)(target + 1) = uVar10;
      target = target + 9;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  pRVar4 = &(this->field_0)._impl_.repeated_sfixed32_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0x80) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar13 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar25);
      iVar8 = *piVar13;
      *target = 0x4d;
      *(int *)(target + 1) = iVar8;
      target = target + 5;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_sfixed64_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      plVar18 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar25);
      lVar9 = *plVar18;
      *target = 0x51;
      *(long *)(target + 1) = lVar9;
      target = target + 9;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  this_00 = &(this->field_0)._impl_.repeated_float_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pfVar19 = google::protobuf::RepeatedField<float>::Get(this_00,iVar25);
      fVar5 = *pfVar19;
      *target = 0x5d;
      *(float *)(target + 1) = fVar5;
      target = target + 5;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  this_01 = &(this->field_0)._impl_.repeated_double_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&this_01->soo_rep_,(*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pdVar20 = google::protobuf::RepeatedField<double>::Get(this_01,iVar25);
      dVar6 = *pdVar20;
      *target = 0x61;
      *(double *)(target + 1) = dVar6;
      target = target + 9;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  this_02 = &(this->field_0)._impl_.repeated_bool_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&this_02->soo_rep_,(*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pbVar21 = google::protobuf::RepeatedField<bool>::Get(this_02,iVar25);
      bVar7 = *pbVar21;
      *target = 0x68;
      target[1] = bVar7;
      target = target + 2;
      iVar25 = iVar25 + 1;
    } while (iVar11 != iVar25);
  }
  pRVar4 = &(this->field_0)._impl_.repeated_nested_enum_;
  iVar11 = google::protobuf::internal::SooRep::size
                     (&pRVar4->soo_rep_,(*(byte *)((long)&this->field_0 + 0xd0) & 4) == 0);
  if (0 < iVar11) {
    iVar25 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar13 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar25);
      uVar14 = (ulong)*piVar13;
      pbVar26 = target + 1;
      *target = 0x70;
      uVar24 = uVar14;
      if (0x7f < uVar14) {
        do {
          *pbVar26 = (byte)uVar24 | 0x80;
          uVar14 = uVar24 >> 7;
          pbVar26 = pbVar26 + 1;
          bVar7 = 0x3fff < uVar24;
          uVar24 = uVar14;
        } while (bVar7);
      }
      *pbVar26 = (byte)uVar14;
      target = pbVar26 + 1;
      iVar25 = iVar25 + 1;
    } while (iVar25 != iVar11);
  }
  uVar24 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar24 & 1) != 0) {
    puVar22 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)((uVar24 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar22;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestUnpackedTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestUnpackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_arena_unittest.TestUnpackedTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 1 [packed = false];
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1, this_._internal_repeated_int32().Get(i), target);
  }

  // repeated int64 repeated_int64 = 2 [packed = false];
  for (int i = 0, n = this_._internal_repeated_int64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt64ToArray(
        2, this_._internal_repeated_int64().Get(i), target);
  }

  // repeated uint32 repeated_uint32 = 3 [packed = false];
  for (int i = 0, n = this_._internal_repeated_uint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        3, this_._internal_repeated_uint32().Get(i), target);
  }

  // repeated uint64 repeated_uint64 = 4 [packed = false];
  for (int i = 0, n = this_._internal_repeated_uint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        4, this_._internal_repeated_uint64().Get(i), target);
  }

  // repeated sint32 repeated_sint32 = 5 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt32ToArray(
        5, this_._internal_repeated_sint32().Get(i), target);
  }

  // repeated sint64 repeated_sint64 = 6 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt64ToArray(
        6, this_._internal_repeated_sint64().Get(i), target);
  }

  // repeated fixed32 repeated_fixed32 = 7 [packed = false];
  for (int i = 0, n = this_._internal_repeated_fixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        7, this_._internal_repeated_fixed32().Get(i), target);
  }

  // repeated fixed64 repeated_fixed64 = 8 [packed = false];
  for (int i = 0, n = this_._internal_repeated_fixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed64ToArray(
        8, this_._internal_repeated_fixed64().Get(i), target);
  }

  // repeated sfixed32 repeated_sfixed32 = 9 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sfixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed32ToArray(
        9, this_._internal_repeated_sfixed32().Get(i), target);
  }

  // repeated sfixed64 repeated_sfixed64 = 10 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sfixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed64ToArray(
        10, this_._internal_repeated_sfixed64().Get(i), target);
  }

  // repeated float repeated_float = 11 [packed = false];
  for (int i = 0, n = this_._internal_repeated_float_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        11, this_._internal_repeated_float().Get(i), target);
  }

  // repeated double repeated_double = 12 [packed = false];
  for (int i = 0, n = this_._internal_repeated_double_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        12, this_._internal_repeated_double().Get(i), target);
  }

  // repeated bool repeated_bool = 13 [packed = false];
  for (int i = 0, n = this_._internal_repeated_bool_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        13, this_._internal_repeated_bool().Get(i), target);
  }

  // repeated .proto3_arena_unittest.TestAllTypes.NestedEnum repeated_nested_enum = 14 [packed = false];
  for (int i = 0, n = this_._internal_repeated_nested_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        14, static_cast<::proto3_arena_unittest::TestAllTypes_NestedEnum>(this_._internal_repeated_nested_enum().Get(i)),
        target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_arena_unittest.TestUnpackedTypes)
  return target;
}